

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector3f.cpp
# Opt level: O1

Vector3f __thiscall
Vector3f::cubicInterpolate
          (Vector3f *this,Vector3f *p0,Vector3f *p1,Vector3f *p2,Vector3f *p3,float t)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ulong uVar4;
  ulong uVar5;
  undefined8 uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  Vector3f VVar21;
  
  fVar10 = t + 1.0;
  fVar1 = p1->m_elements[2];
  fVar7 = p0->m_elements[2] + fVar10 * (fVar1 - p0->m_elements[2]);
  fVar2 = p2->m_elements[2];
  fVar1 = fVar1 + (fVar2 - fVar1) * t;
  fVar8 = t + -1.0;
  fVar3 = p3->m_elements[2];
  fVar11 = fVar10 * 0.5;
  fVar7 = (fVar1 - fVar7) * fVar11 + fVar7;
  fVar9 = t * 0.5;
  uVar4 = *(ulong *)p1->m_elements;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = uVar4;
  uVar5 = *(ulong *)p0->m_elements;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = uVar5;
  auVar17 = vsubps_avx(auVar14,auVar17);
  auVar12._0_4_ = (float)uVar5 + auVar17._0_4_ * fVar10;
  auVar12._4_4_ = (float)(uVar5 >> 0x20) + auVar17._4_4_ * fVar10;
  auVar12._8_4_ = auVar17._8_4_ * fVar10 + 0.0;
  auVar12._12_4_ = auVar17._12_4_ * fVar10 + 0.0;
  uVar5 = *(ulong *)p2->m_elements;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = uVar5;
  auVar17 = vsubps_avx(auVar18,auVar14);
  auVar15._0_4_ = auVar17._0_4_ * t + (float)uVar4;
  auVar15._4_4_ = auVar17._4_4_ * t + (float)(uVar4 >> 0x20);
  auVar15._8_4_ = auVar17._8_4_ * t + 0.0;
  auVar15._12_4_ = auVar17._12_4_ * t + 0.0;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)p3->m_elements;
  auVar17 = vsubps_avx(auVar20,auVar18);
  auVar19._0_4_ = (float)uVar5 + auVar17._0_4_ * fVar8;
  auVar19._4_4_ = (float)(uVar5 >> 0x20) + auVar17._4_4_ * fVar8;
  auVar19._8_4_ = auVar17._8_4_ * fVar8 + 0.0;
  auVar19._12_4_ = auVar17._12_4_ * fVar8 + 0.0;
  auVar17 = vsubps_avx(auVar15,auVar12);
  auVar13._0_4_ = auVar12._0_4_ + fVar11 * auVar17._0_4_;
  auVar13._4_4_ = auVar12._4_4_ + fVar11 * auVar17._4_4_;
  auVar13._8_4_ = auVar12._8_4_ + fVar11 * auVar17._8_4_;
  auVar13._12_4_ = auVar12._12_4_ + fVar11 * auVar17._12_4_;
  auVar17 = vsubps_avx(auVar19,auVar15);
  auVar16._0_4_ = auVar15._0_4_ + fVar9 * auVar17._0_4_;
  auVar16._4_4_ = auVar15._4_4_ + fVar9 * auVar17._4_4_;
  auVar16._8_4_ = auVar15._8_4_ + fVar9 * auVar17._8_4_;
  auVar16._12_4_ = auVar15._12_4_ + fVar9 * auVar17._12_4_;
  auVar17 = vsubps_avx(auVar16,auVar13);
  fVar10 = auVar13._0_4_ + auVar17._0_4_ * t;
  fVar11 = auVar13._4_4_ + auVar17._4_4_ * t;
  uVar6 = vmovlps_avx(CONCAT412(auVar13._12_4_ + auVar17._12_4_ * t,
                                CONCAT48(auVar13._8_4_ + auVar17._8_4_ * t,CONCAT44(fVar11,fVar10)))
                     );
  *(undefined8 *)this->m_elements = uVar6;
  this->m_elements[2] =
       fVar7 + ((fVar1 + fVar9 * ((fVar2 + fVar8 * (fVar3 - fVar2)) - fVar1)) - fVar7) * t;
  VVar21.m_elements[2] = auVar13._0_4_;
  VVar21.m_elements[0] = fVar10;
  VVar21.m_elements[1] = fVar11;
  return (Vector3f)VVar21.m_elements;
}

Assistant:

Vector3f Vector3f::cubicInterpolate( const Vector3f& p0, const Vector3f& p1, const Vector3f& p2, const Vector3f& p3, float t )
{
	// geometric construction:
	//            t
	//   (t+1)/2     t/2
	// t+1        t	        t-1

	// bottom level
	Vector3f p0p1 = Vector3f::lerp( p0, p1, t + 1 );
	Vector3f p1p2 = Vector3f::lerp( p1, p2, t );
	Vector3f p2p3 = Vector3f::lerp( p2, p3, t - 1 );

	// middle level
	Vector3f p0p1_p1p2 = Vector3f::lerp( p0p1, p1p2, 0.5f * ( t + 1 ) );
	Vector3f p1p2_p2p3 = Vector3f::lerp( p1p2, p2p3, 0.5f * t );

	// top level
	return Vector3f::lerp( p0p1_p1p2, p1p2_p2p3, t );
}